

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O3

void __thiscall
chrono::ChFunction_Sequence::ArchiveOUT(ChFunction_Sequence *this,ChArchiveOut *marchive)

{
  ChNameValue<std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>_> local_38
  ;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Sequence>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_38._value = (list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *)&this->start;
  local_38._name = "start";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = &this->functions;
  local_38._name = "functions";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFseqNode>(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Sequence::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Sequence>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(start);
    marchive << CHNVP(functions);
}